

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# examine_stack.cc
# Opt level: O0

void absl::lts_20250127::debugging_internal::anon_unknown_0::DumpPCAndSymbol
               (OutputWriter *writer,void *writer_arg,void *pc,char *prefix)

{
  bool bVar1;
  char local_838 [8];
  char buf [1024];
  uintptr_t prev_pc;
  char *symbol;
  char tmp [1024];
  char *prefix_local;
  void *pc_local;
  void *writer_arg_local;
  OutputWriter *writer_local;
  
  prev_pc = (uintptr_t)anon_var_dwarf_34ab1a5;
  buf._1016_8_ = (long)pc + -1;
  tmp._1016_8_ = prefix;
  bVar1 = Symbolize((void *)buf._1016_8_,(char *)&symbol,0x400);
  if ((bVar1) || (bVar1 = Symbolize(pc,(char *)&symbol,0x400), bVar1)) {
    prev_pc = (uintptr_t)&symbol;
  }
  snprintf(local_838,0x400,"%s@ %*p  %s\n",tmp._1016_8_,0x12,pc,prev_pc);
  (*writer)(local_838,writer_arg);
  return;
}

Assistant:

void DumpPCAndSymbol(OutputWriter* writer, void* writer_arg, void* const pc,
                     const char* const prefix) {
  char tmp[1024];
  const char* symbol = "(unknown)";
  // Symbolizes the previous address of pc because pc may be in the
  // next function.  The overrun happens when the function ends with
  // a call to a function annotated noreturn (e.g. CHECK).
  // If symbolization of pc-1 fails, also try pc on the off-chance
  // that we crashed on the first instruction of a function (that
  // actually happens very often for e.g. __restore_rt).
  const uintptr_t prev_pc = reinterpret_cast<uintptr_t>(pc) - 1;
  if (absl::Symbolize(reinterpret_cast<const char*>(prev_pc), tmp,
                      sizeof(tmp)) ||
      absl::Symbolize(pc, tmp, sizeof(tmp))) {
    symbol = tmp;
  }
  char buf[1024];
  snprintf(buf, sizeof(buf), "%s@ %*p  %s\n", prefix, kPrintfPointerFieldWidth,
           pc, symbol);
  writer(buf, writer_arg);
}